

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O0

shared_ptr<TestClientContextState,_true> WithLifecycleState(Connection *conn)

{
  ClientContext *pCVar1;
  string *key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RegisteredStateManager *in_RSI;
  element_type *in_RDI;
  shared_ptr<TestClientContextState,_true> sVar2;
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
  *register_state;
  shared_ptr<TestClientContextState,_true> *state;
  shared_ptr<TestClientContextState,_true> *in_stack_ffffffffffffff68;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff70;
  shared_ptr<duckdb::ClientContextState,_true> local_68;
  allocator local_51;
  string local_50 [48];
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  
  pCVar1 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(in_stack_ffffffffffffff70);
  key = (string *)(pCVar1 + 0x28);
  uVar3 = 0;
  duckdb::make_shared_ptr<TestClientContextState>();
  duckdb::
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
  ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                *)in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"test_state",&local_51);
  duckdb::shared_ptr<duckdb::ClientContextState,_true>::shared_ptr<TestClientContextState,_0>
            (&local_68,in_stack_ffffffffffffff68);
  duckdb::RegisteredStateManager::Insert
            (in_RSI,key,
             (shared_ptr<duckdb::ClientContextState,_true> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffe0));
  duckdb::shared_ptr<duckdb::ClientContextState,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContextState,_true> *)0x59bbfb);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<TestClientContextState,_true>)
         sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TestClientContextState> WithLifecycleState(const Connection &conn) {
	auto &register_state = conn.context->registered_state;
	auto state = make_shared_ptr<TestClientContextState>();
	register_state->Insert("test_state", state);
	return state;
}